

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O3

void __thiscall
slang::ast::Compilation::insertDefinition(Compilation *this,Symbol *symbol,Scope *scope)

{
  size_t *psVar1;
  long lVar2;
  SyntaxKind SVar3;
  RootSymbol *pRVar4;
  group_type_pointer pgVar5;
  group_type_pointer pgVar6;
  Symbol *pSVar7;
  size_t sVar8;
  uint uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *pvVar13;
  Compilation **ppCVar14;
  Symbol *pSVar15;
  bool bVar16;
  byte bVar17;
  uint uVar18;
  Diagnostic *pDVar19;
  SourceLibrary *pSVar20;
  SourceLibrary *pSVar21;
  value_type_pointer ppVar22;
  SyntaxNode *pSVar23;
  value_type_pointer ppVar24;
  SourceLocation SVar25;
  Compilation *pCVar26;
  Scope *pSVar27;
  DiagCode code;
  SourceLocation SVar28;
  pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool> *ppVar29;
  string_view *psVar30;
  const_iterator cVar31;
  _Head_base<1UL,_const_slang::ast::Scope_*,_false> _Var32;
  ulong uVar33;
  value_type_pointer ppVar34;
  ulong uVar35;
  Scope *pSVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  uchar uVar40;
  uchar uVar41;
  uchar uVar42;
  byte bVar43;
  uchar uVar44;
  uchar uVar45;
  uchar uVar46;
  byte bVar47;
  uchar uVar48;
  uchar uVar49;
  uchar uVar50;
  byte bVar51;
  uchar uVar52;
  uchar uVar53;
  uchar uVar54;
  byte bVar55;
  initializer_list<slang::ast::Symbol_*> __l;
  string_view name;
  DiagCode in_stack_fffffffffffffe98;
  try_emplace_args_t local_161;
  value_type_pointer local_160;
  Scope *local_158;
  allocator_type local_149;
  undefined8 local_148;
  uchar uStack_140;
  uchar uStack_13f;
  uchar uStack_13e;
  byte bStack_13d;
  uchar uStack_13c;
  uchar uStack_13b;
  uchar uStack_13a;
  byte bStack_139;
  pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool> *local_138;
  SourceLocation local_130;
  table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>>>
  *local_128;
  Compilation *local_120;
  const_iterator local_118;
  uchar uStack_110;
  uchar uStack_10f;
  uchar uStack_10e;
  byte bStack_10d;
  uchar uStack_10c;
  uchar uStack_10b;
  uchar uStack_10a;
  byte bStack_109;
  string_view *local_100;
  size_t seed;
  SyntaxNode *pSStack_f0;
  value_type_pointer local_e8;
  bool local_e0;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*> key;
  size_t seed_1;
  size_t local_b8;
  pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>
  *ppStack_b0;
  vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> local_a8;
  group_type_pointer local_88;
  value_type_pointer local_80;
  anon_class_16_2_6b3e7b47 reportRedefinition;
  Symbol *local_38;
  
  pRVar4 = (this->root)._M_t.
           super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
           ._M_t.
           super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
           .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
  pSVar27 = &pRVar4->super_Scope;
  if (pRVar4 == (RootSymbol *)0x0) {
    pSVar27 = (Scope *)0x0;
  }
  _Var32._M_head_impl = scope;
  if (scope->thisSym->kind == CompilationUnit) {
    _Var32._M_head_impl = pSVar27;
  }
  key.
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
  .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>._M_head_impl.
  _M_len = (symbol->name)._M_len;
  key.
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
  .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>._M_head_impl.
  _M_str = (symbol->name)._M_str;
  if ((symbol->name)._M_len == 0) {
    return;
  }
  local_100 = &symbol->name;
  local_128 = (table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>>>
               *)&this->definitionMap;
  seed = 0;
  local_158 = scope;
  key.
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
  .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
  super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl =
       (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)
       (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)_Var32._M_head_impl;
  reportRedefinition.symbol = symbol;
  reportRedefinition.scope = scope;
  slang::detail::hashing::
  HashValueImpl<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_1UL>
  ::apply(&seed,&key);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = seed;
  uVar33 = SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar10,8) ^
           SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar10,0);
  ppVar24 = (value_type_pointer)
            (uVar33 >>
            ((byte)(this->definitionMap).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                   .arrays.groups_size_index & 0x3f));
  lVar2 = (uVar33 & 0xff) * 4;
  uVar40 = (&UNK_0048f58c)[lVar2];
  uVar41 = (&UNK_0048f58d)[lVar2];
  uVar42 = (&UNK_0048f58e)[lVar2];
  bVar43 = (&UNK_0048f58f)[lVar2];
  SVar28 = (SourceLocation)0x0;
  uVar44 = uVar40;
  uVar45 = uVar41;
  uVar46 = uVar42;
  bVar47 = bVar43;
  uVar48 = uVar40;
  uVar49 = uVar41;
  uVar50 = uVar42;
  bVar51 = bVar43;
  uVar52 = uVar40;
  uVar53 = uVar41;
  uVar54 = uVar42;
  bVar55 = bVar43;
  local_120 = this;
LAB_002db0f9:
  pgVar5 = (this->definitionMap).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
           .arrays.groups_;
  pgVar6 = pgVar5 + (long)ppVar24;
  bVar17 = pgVar6->m[0xf].n;
  auVar37[0] = -(pgVar6->m[0].n == uVar40);
  auVar37[1] = -(pgVar6->m[1].n == uVar41);
  auVar37[2] = -(pgVar6->m[2].n == uVar42);
  auVar37[3] = -(pgVar6->m[3].n == bVar43);
  auVar37[4] = -(pgVar6->m[4].n == uVar44);
  auVar37[5] = -(pgVar6->m[5].n == uVar45);
  auVar37[6] = -(pgVar6->m[6].n == uVar46);
  auVar37[7] = -(pgVar6->m[7].n == bVar47);
  auVar37[8] = -(pgVar6->m[8].n == uVar48);
  auVar37[9] = -(pgVar6->m[9].n == uVar49);
  auVar37[10] = -(pgVar6->m[10].n == uVar50);
  auVar37[0xb] = -(pgVar6->m[0xb].n == bVar51);
  auVar37[0xc] = -(pgVar6->m[0xc].n == uVar52);
  auVar37[0xd] = -(pgVar6->m[0xd].n == uVar53);
  auVar37[0xe] = -(pgVar6->m[0xe].n == uVar54);
  auVar37[0xf] = -(bVar17 == bVar55);
  uVar18 = (uint)(ushort)((ushort)(SUB161(auVar37 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar37 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar37 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar37 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar37 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar37 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar37 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar37 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar37 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar37 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar37 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar37 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar37 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar37 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar37 >> 0x77,0) & 1) << 0xe);
  if (uVar18 != 0) {
    local_118._M_current._1_1_ = uVar41;
    local_118._M_current._0_1_ = uVar40;
    local_118._M_current._2_1_ = uVar42;
    local_118._M_current._3_1_ = bVar43;
    local_118._M_current._4_1_ = uVar44;
    local_118._M_current._5_1_ = uVar45;
    local_118._M_current._6_1_ = uVar46;
    local_118._M_current._7_1_ = bVar47;
    local_138 = (pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>
                 *)(pgVar5 + (long)ppVar24);
    ppVar22 = (this->definitionMap).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
              .arrays.elements_;
    local_160 = ppVar24;
    local_130 = SVar28;
    uStack_110 = uVar48;
    uStack_10f = uVar49;
    uStack_10e = uVar50;
    bStack_10d = bVar51;
    uStack_10c = uVar52;
    uStack_10b = uVar53;
    uStack_10a = uVar54;
    bStack_109 = bVar55;
LAB_002db162:
    local_148 = (Symbol *)(ulong)uVar18;
    uVar9 = 0;
    if (uVar18 != 0) {
      for (; (uVar18 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
      }
    }
    ppVar34 = ppVar22 + (long)ppVar24 * 0xf + (ulong)uVar9;
    bVar16 = std::
             __tuple_compare<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_0UL,_2UL>
             ::__eq(&key,&ppVar34->first);
    if (!bVar16) goto code_r0x002db181;
    ppVar29 = &ppVar34->second;
    if (_Var32._M_head_impl == pSVar27) {
      ppVar24 = (value_type_pointer)
                (ppVar34->second).first.
                super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppVar22 = (value_type_pointer)
                (ppVar34->second).first.
                super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      uVar33 = (long)ppVar22 - (long)ppVar24 >> 3;
      local_160 = ppVar34;
      pSVar7 = symbol;
      local_138 = ppVar29;
      if (0 < (long)uVar33) {
        do {
          local_148 = pSVar7;
          uVar35 = uVar33 >> 1;
          pSVar20 = Symbol::getSourceLibrary
                              ((Symbol *)
                               (&(ppVar24->first).
                                 super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                 .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>)[uVar35].
                               super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl)
          ;
          pSVar21 = Symbol::getSourceLibrary(local_148);
          if (pSVar20->priority < pSVar21->priority) {
            ppVar24 = (value_type_pointer)
                      (&(ppVar24->first).
                        super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                        .
                        super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                        ._M_head_impl._M_len + uVar35);
            uVar35 = ~uVar35 + uVar33;
          }
          uVar33 = uVar35;
          pSVar7 = local_148;
        } while (0 < (long)uVar35);
        ppVar22 = (value_type_pointer)
                  (local_160->second).first.
                  super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        symbol = local_148;
      }
      ppVar34 = local_160;
      local_118._M_current = (Symbol **)ppVar24;
      if ((ppVar24 != ppVar22) &&
         (pSVar20 = Symbol::getSourceLibrary(symbol),
         (value_type_pointer)local_118._M_current !=
         (value_type_pointer)
         (ppVar34->second).first.
         super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>._M_impl.
         super__Vector_impl_data._M_finish)) {
        local_148 = (Symbol *)((ulong)local_148 & 0xffffffff00000000);
        cVar31._M_current = local_118._M_current;
        do {
          pSVar7 = (Symbol *)
                   (((value_type_pointer)cVar31._M_current)->first).
                   super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                   .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
                   super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl;
          pSVar21 = Symbol::getSourceLibrary(pSVar7);
          pSVar15 = local_148;
          if (pSVar21 == pSVar20) {
            sVar8 = (symbol->name)._M_len;
            if (pSVar7->kind != symbol->kind) {
              if (sVar8 == 0) {
                return;
              }
              SVar28 = pSVar7->location;
              SVar25 = symbol->location;
              code.subsystem = Lookup;
              code.code = 0x2a;
LAB_002db466:
              pDVar19 = Scope::addDiag(local_158,code,SVar25);
              Diagnostic::operator<<(pDVar19,symbol->name);
              Diagnostic::addNote(pDVar19,(DiagCode)0xa0001,SVar28);
              return;
            }
            local_148 = (Symbol *)CONCAT44(local_148._4_4_,(int)CONCAT71((int7)(sVar8 >> 8),1));
            if (((ulong)pSVar15 & 1) == 0 && sVar8 != 0) {
              local_130 = pSVar7->location;
              pDVar19 = Scope::addDiag(local_158,(DiagCode)0x40000a,symbol->location);
              Diagnostic::operator<<(pDVar19,symbol->name);
              Diagnostic::addNote(pDVar19,(DiagCode)0xa0001,local_130);
            }
          }
          else if (pSVar21->priority != pSVar20->priority) break;
          cVar31._M_current =
               (Symbol **)
               &(((value_type_pointer)cVar31._M_current)->first).
                super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
          ;
        } while (cVar31._M_current !=
                 (local_160->second).first.
                 super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      }
      seed = (size_t)symbol;
      std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>::_M_insert_rval
                (&local_138->first,local_118,(value_type *)&seed);
      pSVar36 = local_158;
      goto LAB_002db5f9;
    }
    if (local_100->_M_len == 0) {
      return;
    }
    SVar28 = (*(ppVar29->first).
               super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>.
               _M_impl.super__Vector_impl_data._M_start)->location;
    SVar25 = symbol->location;
    code.subsystem = Lookup;
    code.code = 0x40;
    goto LAB_002db466;
  }
  goto LAB_002db1bd;
code_r0x002db181:
  uVar18 = (uint)local_148 - 1 & (uint)local_148;
  if (uVar18 == 0) goto code_r0x002db197;
  goto LAB_002db162;
code_r0x002db197:
  bVar17 = *(byte *)((long)&(local_138->first).
                            super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish + 7);
  ppVar24 = local_160;
  this = local_120;
  SVar28 = local_130;
  uVar40 = (uchar)local_118._M_current;
  uVar41 = local_118._M_current._1_1_;
  uVar42 = local_118._M_current._2_1_;
  bVar43 = local_118._M_current._3_1_;
  uVar44 = local_118._M_current._4_1_;
  uVar45 = local_118._M_current._5_1_;
  uVar46 = local_118._M_current._6_1_;
  bVar47 = local_118._M_current._7_1_;
  uVar48 = uStack_110;
  uVar49 = uStack_10f;
  uVar50 = uStack_10e;
  bVar51 = bStack_10d;
  uVar52 = uStack_10c;
  uVar53 = uStack_10b;
  uVar54 = uStack_10a;
  bVar55 = bStack_109;
LAB_002db1bd:
  if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
         is_not_overflowed(unsigned_long)::shift)[(uint)uVar33 & 7] & bVar17) == 0)
  goto LAB_002db1e7;
  SVar25 = (SourceLocation)
           (this->definitionMap).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
           .arrays.groups_size_mask;
  lVar2 = (long)SVar28 + 1;
  SVar28 = (SourceLocation)((long)SVar28 + 1);
  ppVar24 = (value_type_pointer)
            ((long)&(ppVar24->first).
                    super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                    .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
                    super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl + lVar2 &
            (ulong)SVar25);
  if ((ulong)SVar25 < (ulong)SVar28) goto LAB_002db1e7;
  goto LAB_002db0f9;
LAB_002db1e7:
  __l._M_len = 1;
  __l._M_array = &local_38;
  local_38 = symbol;
  std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>::vector
            (&local_a8,__l,&local_149);
  local_e0 = _Var32._M_head_impl != pSVar27;
  seed = (size_t)local_a8.
                 super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  pSStack_f0 = (SyntaxNode *)
               local_a8.
               super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
  local_e8 = (value_type_pointer)
             local_a8.
             super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  local_a8.super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  seed_1 = 0;
  slang::detail::hashing::
  HashValueImpl<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_1UL>
  ::apply(&seed_1,&key);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = seed_1;
  uVar33 = SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar11,8) ^
           SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar11,0);
  ppVar24 = (value_type_pointer)(uVar33 >> ((byte)*local_128 & 0x3f));
  lVar2 = (uVar33 & 0xff) * 4;
  uVar40 = (&UNK_0048f58c)[lVar2];
  uVar41 = (&UNK_0048f58d)[lVar2];
  uVar42 = (&UNK_0048f58e)[lVar2];
  bVar43 = (&UNK_0048f58f)[lVar2];
  SVar28._0_4_ = (uint)uVar33 & 7;
  SVar28._4_4_ = 0;
  ppVar29 = (pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool> *)
            0x0;
  ppVar22 = ppVar24;
  uVar44 = uVar40;
  uVar45 = uVar41;
  uVar46 = uVar42;
  bVar47 = bVar43;
  uVar48 = uVar40;
  uVar49 = uVar41;
  uVar50 = uVar42;
  bVar51 = bVar43;
  uVar52 = uVar40;
  uVar53 = uVar41;
  uVar54 = uVar42;
  bVar55 = bVar43;
  do {
    pgVar5 = (this->definitionMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
             .arrays.groups_;
    pgVar6 = pgVar5 + (long)ppVar24;
    bVar17 = pgVar6->m[0xf].n;
    auVar38[0] = -(pgVar6->m[0].n == uVar40);
    auVar38[1] = -(pgVar6->m[1].n == uVar41);
    auVar38[2] = -(pgVar6->m[2].n == uVar42);
    auVar38[3] = -(pgVar6->m[3].n == bVar43);
    auVar38[4] = -(pgVar6->m[4].n == uVar44);
    auVar38[5] = -(pgVar6->m[5].n == uVar45);
    auVar38[6] = -(pgVar6->m[6].n == uVar46);
    auVar38[7] = -(pgVar6->m[7].n == bVar47);
    auVar38[8] = -(pgVar6->m[8].n == uVar48);
    auVar38[9] = -(pgVar6->m[9].n == uVar49);
    auVar38[10] = -(pgVar6->m[10].n == uVar50);
    auVar38[0xb] = -(pgVar6->m[0xb].n == bVar51);
    auVar38[0xc] = -(pgVar6->m[0xc].n == uVar52);
    auVar38[0xd] = -(pgVar6->m[0xd].n == uVar53);
    auVar38[0xe] = -(pgVar6->m[0xe].n == uVar54);
    auVar38[0xf] = -(bVar17 == bVar55);
    uVar18 = (uint)(ushort)((ushort)(SUB161(auVar38 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar38 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar38 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar38 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar38 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar38 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar38 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar38 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar38 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar38 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar38 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar38 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar38 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar38 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar38 >> 0x77,0) & 1) << 0xe);
    if (uVar18 != 0) {
      local_118._M_current._1_1_ = uVar41;
      local_118._M_current._0_1_ = uVar40;
      local_118._M_current._2_1_ = uVar42;
      local_118._M_current._3_1_ = bVar43;
      local_118._M_current._4_1_ = uVar44;
      local_118._M_current._5_1_ = uVar45;
      local_118._M_current._6_1_ = uVar46;
      local_118._M_current._7_1_ = bVar47;
      local_88 = pgVar5 + (long)ppVar24;
      local_148 = (Symbol *)
                  ((this->definitionMap).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                   .arrays.elements_ + (long)ppVar24 * 0xf);
      local_160 = ppVar22;
      local_138 = ppVar29;
      local_130 = SVar28;
      uStack_110 = uVar48;
      uStack_10f = uVar49;
      uStack_10e = uVar50;
      bStack_10d = bVar51;
      uStack_10c = uVar52;
      uStack_10b = uVar53;
      uStack_10a = uVar54;
      bStack_109 = bVar55;
      local_80 = ppVar24;
      do {
        uVar9 = 0;
        if (uVar18 != 0) {
          for (; (uVar18 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
          }
        }
        bVar16 = std::
                 __tuple_compare<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_0UL,_2UL>
                 ::__eq(&key,(tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                              *)(&local_148->kind + (ulong)uVar9 * 0xe));
        if (bVar16) goto LAB_002db3f1;
        uVar18 = uVar18 - 1 & uVar18;
      } while (uVar18 != 0);
      bVar17 = local_88->m[0xf].n;
      SVar28 = local_130;
      this = local_120;
      ppVar29 = local_138;
      ppVar24 = local_80;
      ppVar22 = local_160;
      uVar40 = (uchar)local_118._M_current;
      uVar41 = local_118._M_current._1_1_;
      uVar42 = local_118._M_current._2_1_;
      bVar43 = local_118._M_current._3_1_;
      uVar44 = local_118._M_current._4_1_;
      uVar45 = local_118._M_current._5_1_;
      uVar46 = local_118._M_current._6_1_;
      bVar47 = local_118._M_current._7_1_;
      uVar48 = uStack_110;
      uVar49 = uStack_10f;
      uVar50 = uStack_10e;
      bVar51 = bStack_10d;
      uVar52 = uStack_10c;
      uVar53 = uStack_10b;
      uVar54 = uStack_10a;
      bVar55 = bStack_109;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(long)SVar28] & bVar17) == 0) break;
    pgVar6 = (group_type_pointer)
             (this->definitionMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
             .arrays.groups_size_mask;
    pvVar13 = &ppVar29->first;
    ppVar29 = (pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>
               *)((long)&(ppVar29->first).
                         super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>
                         ._M_impl.super__Vector_impl_data._M_start + 1);
    ppVar24 = (value_type_pointer)
              ((ulong)((undefined1 *)
                       ((long)&(ppVar24->first).
                               super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                               .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
                               super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl
                       + 1) + (long)&pvVar13->
                                     super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>
                      ) & (ulong)pgVar6);
  } while (ppVar29 <= pgVar6);
  if ((this->definitionMap).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
      .size_ctrl.size <
      (this->definitionMap).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>&,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>
              ((locator *)&seed_1,local_128,(arrays_type *)local_128,(size_t)ppVar22,uVar33,
               &local_161,&key,
               (pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>
                *)&seed);
    psVar1 = &(this->definitionMap).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>&,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>
              ((locator *)&seed_1,local_128,uVar33,&local_161,&key,
               (pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>
                *)&seed);
  }
LAB_002db3f1:
  if (seed != 0) {
    operator_delete((void *)seed,(long)local_e8 - seed);
  }
  pSVar36 = local_158;
  if (local_a8.super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.
                    super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.
                          super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.
                          super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_002db5f9:
  pCVar26 = local_120;
  if (_Var32._M_head_impl == pSVar27) {
    pSVar23 = getExternDefinition(local_120,symbol->name,pSVar36);
    if (pSVar23 != (SyntaxNode *)0x0) {
      SVar3 = pSVar23->kind;
      if (symbol->kind == Definition && SVar3 == ExternModuleDecl) {
        checkExternModMatch(pSVar36,(ModuleHeaderSyntax *)pSVar23[6].parent,
                            (ModuleHeaderSyntax *)symbol->originatingSyntax[3].parent,
                            (DiagCode)0xb000d);
      }
      else if (symbol->kind == Primitive && SVar3 == ExternUdpDecl) {
        name._M_str = (char *)0xb000d;
        name._M_len = (size_t)(symbol->name)._M_str;
        checkExternUdpMatch((ast *)pSVar36,(Scope *)pSVar23[7].previewNode,
                            (UdpPortListSyntax *)symbol->originatingSyntax[4].previewNode,
                            (UdpPortListSyntax *)(symbol->name)._M_len,name,
                            in_stack_fffffffffffffe98);
      }
      else {
        if (SVar3 == ExternModuleDecl) {
          pSVar23 = (SyntaxNode *)&pSVar23[6].parent[2].parent;
        }
        else {
          pSVar23 = pSVar23 + 7;
        }
        seed = *(size_t *)pSVar23;
        pSStack_f0 = pSVar23->parent;
        SVar28 = parsing::Token::location((Token *)&seed);
        insertDefinition::anon_class_16_2_6b3e7b47::operator()
                  (&reportRedefinition,SVar28,(DiagCode)0x2a000a);
      }
    }
  }
  else {
    pRVar4 = (local_120->root)._M_t.
             super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
             ._M_t.
             super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
             .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
    local_b8 = local_100->_M_len;
    ppStack_b0 = (pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>
                  *)local_100->_M_str;
    seed_1 = (size_t)&pRVar4->super_Scope;
    if (pRVar4 == (RootSymbol *)0x0) {
      seed_1 = 0;
    }
    seed = 0;
    slang::detail::hashing::
    HashValueImpl<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_1UL>
    ::apply(&seed,(tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                   *)&seed_1);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = seed;
    uVar33 = SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar12,8) ^
             SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar12,0);
    ppVar24 = (value_type_pointer)
              (uVar33 >>
              ((byte)(pCVar26->definitionMap).table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                     .arrays.groups_size_index & 0x3f));
    lVar2 = (uVar33 & 0xff) * 4;
    uVar40 = (&UNK_0048f58c)[lVar2];
    uVar41 = (&UNK_0048f58d)[lVar2];
    uVar42 = (&UNK_0048f58e)[lVar2];
    bVar43 = (&UNK_0048f58f)[lVar2];
    psVar30 = (string_view *)(ulong)((uint)uVar33 & 7);
    pSVar27 = (Scope *)0x0;
    cVar31._M_current = (Symbol **)ppVar24;
    uVar44 = uVar40;
    uVar45 = uVar41;
    uVar46 = uVar42;
    bVar47 = bVar43;
    uVar48 = uVar40;
    uVar49 = uVar41;
    uVar50 = uVar42;
    bVar51 = bVar43;
    uVar52 = uVar40;
    uVar53 = uVar41;
    uVar54 = uVar42;
    bVar55 = bVar43;
    do {
      pgVar5 = (pCVar26->definitionMap).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
               .arrays.groups_;
      pgVar6 = pgVar5 + (long)ppVar24;
      bVar17 = pgVar6->m[0xf].n;
      auVar39[0] = -(pgVar6->m[0].n == uVar40);
      auVar39[1] = -(pgVar6->m[1].n == uVar41);
      auVar39[2] = -(pgVar6->m[2].n == uVar42);
      auVar39[3] = -(pgVar6->m[3].n == bVar43);
      auVar39[4] = -(pgVar6->m[4].n == uVar44);
      auVar39[5] = -(pgVar6->m[5].n == uVar45);
      auVar39[6] = -(pgVar6->m[6].n == uVar46);
      auVar39[7] = -(pgVar6->m[7].n == bVar47);
      auVar39[8] = -(pgVar6->m[8].n == uVar48);
      auVar39[9] = -(pgVar6->m[9].n == uVar49);
      auVar39[10] = -(pgVar6->m[10].n == uVar50);
      auVar39[0xb] = -(pgVar6->m[0xb].n == bVar51);
      auVar39[0xc] = -(pgVar6->m[0xc].n == uVar52);
      auVar39[0xd] = -(pgVar6->m[0xd].n == uVar53);
      auVar39[0xe] = -(pgVar6->m[0xe].n == uVar54);
      auVar39[0xf] = -(bVar17 == bVar55);
      uVar18 = (uint)(ushort)((ushort)(SUB161(auVar39 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar39 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar39 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar39 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar39 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar39 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar39 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar39 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar39 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar39 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar39 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar39 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar39 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar39 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar39 >> 0x77,0) & 1) << 0xe);
      if (uVar18 != 0) {
        local_148 = (Symbol *)
                    CONCAT17(bVar47,CONCAT16(uVar46,CONCAT15(uVar45,CONCAT14(uVar44,CONCAT13(bVar43,
                                                  CONCAT12(uVar42,CONCAT11(uVar41,uVar40)))))));
        ppVar22 = (pCVar26->definitionMap).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                  .arrays.elements_;
        local_160 = ppVar24;
        local_158 = pSVar27;
        uStack_140 = uVar48;
        uStack_13f = uVar49;
        uStack_13e = uVar50;
        bStack_13d = bVar51;
        uStack_13c = uVar52;
        uStack_13b = uVar53;
        uStack_13a = uVar54;
        bStack_139 = bVar55;
        local_118._M_current = cVar31._M_current;
        local_100 = psVar30;
        do {
          uVar9 = 0;
          if (uVar18 != 0) {
            for (; (uVar18 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
            }
          }
          ppVar34 = ppVar22 + (long)ppVar24 * 0xf + (ulong)uVar9;
          bVar16 = std::
                   __tuple_compare<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_0UL,_2UL>
                   ::__eq((tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                           *)&seed_1,&ppVar34->first);
          if (bVar16) goto LAB_002db899;
          uVar18 = uVar18 - 1 & uVar18;
        } while (uVar18 != 0);
        bVar17 = pgVar5[(long)ppVar24].m[0xf].n;
        pSVar27 = local_158;
        ppVar24 = local_160;
        psVar30 = local_100;
        cVar31._M_current = local_118._M_current;
        uVar40 = (uchar)local_148;
        uVar41 = local_148._1_1_;
        uVar42 = local_148._2_1_;
        bVar43 = local_148._3_1_;
        uVar44 = local_148._4_1_;
        uVar45 = local_148._5_1_;
        uVar46 = local_148._6_1_;
        bVar47 = local_148._7_1_;
        uVar48 = uStack_140;
        uVar49 = uStack_13f;
        uVar50 = uStack_13e;
        bVar51 = bStack_13d;
        uVar52 = uStack_13c;
        uVar53 = uStack_13b;
        uVar54 = uStack_13a;
        bVar55 = bStack_139;
      }
      pCVar26 = local_120;
      if ((*(byte *)(psVar30 + 0x48f98) & bVar17) == 0) break;
      pSVar36 = (Scope *)(local_120->definitionMap).table_.
                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                         .arrays.groups_size_mask;
      ppCVar14 = &pSVar27->compilation;
      pSVar27 = (Scope *)((long)&pSVar27->compilation + 1);
      ppVar24 = (value_type_pointer)
                ((ulong)((long)ppCVar14 +
                        (long)((long)&(ppVar24->first).
                                      super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                      .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
                                      super__Head_base<1UL,_const_slang::ast::Scope_*,_false>.
                                      _M_head_impl + 1)) & (ulong)pSVar36);
    } while (pSVar27 <= pSVar36);
    if ((local_120->definitionMap).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
        .size_ctrl.size <
        (local_120->definitionMap).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>
                ((locator *)&seed,local_128,(arrays_type *)local_128,(size_t)cVar31._M_current,
                 uVar33,(try_emplace_args_t *)&local_a8,
                 (tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                  *)&seed_1);
      psVar1 = &(pCVar26->definitionMap).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
      ppVar34 = local_e8;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>
                ((locator *)&seed,local_128,uVar33,(try_emplace_args_t *)&local_a8,
                 (tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                  *)&seed_1);
      ppVar34 = local_e8;
    }
LAB_002db899:
    (ppVar34->second).second = true;
  }
  return;
}

Assistant:

void Compilation::insertDefinition(Symbol& symbol, const Scope& scope) {
    SLANG_ASSERT(!isFrozen());

    auto reportRedefinition = [&](SourceLocation oldLoc, DiagCode code) {
        if (!symbol.name.empty()) {
            auto& diag = scope.addDiag(code, symbol.location);
            diag << symbol.name;
            diag.addNote(diag::NotePreviousDefinition, oldLoc);
        }
    };

    // Record that the given scope contains this definition. If the scope is a compilation unit, add
    // it to the root scope instead so that lookups from other compilation units will find it.
    auto targetScope = scope.asSymbol().kind == SymbolKind::CompilationUnit ? root.get() : &scope;
    const bool isRoot = targetScope == root.get();
    auto key = std::tuple(symbol.name, targetScope);
    if (symbol.name.empty())
        return;

    if (auto it = definitionMap.find(key); it != definitionMap.end()) {
        // There is already a definition with this name in this scope.
        // If we're not at the root scope, it's a straightforward error.
        auto& defList = it->second.first;
        if (!isRoot) {
            SLANG_ASSERT(defList[0]);
            reportRedefinition(defList[0]->location, diag::DuplicateDefinition);
            return;
        }

        // Otherwise we have a duplicate at the root scope; figure out where
        // we should insert this definition. If they are in different libraries
        // then keep them sorted in priority order. If they're in the same library
        // then we want to error (or maybe warn).
        auto vecIt = std::ranges::lower_bound(defList, &symbol, [](auto a, auto b) {
            auto libA = a->getSourceLibrary();
            auto libB = b->getSourceLibrary();
            SLANG_ASSERT(libA && libB);
            return libA->priority < libB->priority;
        });

        if (vecIt != defList.end()) {
            bool warned = false;
            auto symLib = symbol.getSourceLibrary();
            for (auto v = vecIt; v != defList.end(); v++) {
                auto vSym = *v;
                auto vLib = vSym->getSourceLibrary();
                if (vLib == symLib) {
                    // Duplicate in the same library. If they are both the same kind
                    // then we report a warning and take the first one, otherwise
                    // we give a hard error.
                    if (vSym->kind == symbol.kind) {
                        if (!warned) {
                            // We keep going after this because there might also
                            // be a mismatching primitive / definition worth erroring about
                            // and the DuplicateDefinition warning can be suppressed.
                            reportRedefinition(vSym->location, diag::DuplicateDefinition);
                            warned = true;
                        }
                    }
                    else {
                        reportRedefinition(vSym->location, diag::Redefinition);
                        return;
                    }
                }
                else if (vLib->priority != symLib->priority) {
                    // We know for sure there are no more duplicates because the
                    // library and/or the priority has changed.
                    break;
                }
            }
        }

        defList.insert(vecIt, &symbol);
    }
    else {
        definitionMap.emplace(key, std::pair{std::vector{&symbol}, !isRoot});
    }

    if (isRoot) {
        // TODO: how do extern modules work with libraries?
        if (auto externDef = getExternDefinition(symbol.name, scope)) {
            auto syntax = symbol.getSyntax();
            SLANG_ASSERT(syntax);

            if (externDef->kind == SyntaxKind::ExternModuleDecl &&
                symbol.kind == SymbolKind::Definition) {
                checkExternModMatch(scope, *externDef->as<ExternModuleDeclSyntax>().header,
                                    *syntax->as<ModuleDeclarationSyntax>().header,
                                    diag::ExternDeclMismatchImpl);
            }
            else if (externDef->kind == SyntaxKind::ExternUdpDecl &&
                     symbol.kind == SymbolKind::Primitive) {
                checkExternUdpMatch(scope, *externDef->as<ExternUdpDeclSyntax>().portList,
                                    *syntax->as<UdpDeclarationSyntax>().portList, symbol.name,
                                    diag::ExternDeclMismatchImpl);
            }
            else {
                reportRedefinition(getExternNameToken(*externDef).location(), diag::Redefinition);
            }
        }
    }
    else {
        // Record the fact that we have nested modules with this name.
        definitionMap[std::tuple(symbol.name, root.get())].second = true;
    }
}